

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateGenericFunctionPrototype
               (ExpressionTranslateContext *ctx,ExprGenericFunctionPrototype *expression)

{
  SynIdentifier *pSVar1;
  ExprVariableDefinition *expression_00;
  char *format;
  IntrusiveList<ExprVariableDefinition> *pIVar2;
  
  pSVar1 = expression->function->name;
  Print(ctx,"/* Definition of generic function prototype \'%.*s\' */",
        (ulong)(uint)(*(int *)&(pSVar1->name).end - (int)(pSVar1->name).begin));
  if ((expression->contextVariables).head == (ExprVariableDefinition *)0x0) {
    format = "0";
  }
  else {
    Print(ctx,"(");
    PrintLine(ctx);
    ctx->depth = ctx->depth + 1;
    pIVar2 = &expression->contextVariables;
    while (expression_00 = pIVar2->head, expression_00 != (ExprVariableDefinition *)0x0) {
      PrintIndent(ctx);
      Translate(ctx,&expression_00->super_ExprBase);
      if ((expression_00->super_ExprBase).next != (ExprBase *)0x0) {
        Print(ctx,", ");
      }
      PrintLine(ctx);
      pIVar2 = (IntrusiveList<ExprVariableDefinition> *)&(expression_00->super_ExprBase).next;
    }
    ctx->depth = ctx->depth - 1;
    PrintIndent(ctx);
    format = ")";
  }
  Print(ctx,format);
  return;
}

Assistant:

void TranslateGenericFunctionPrototype(ExpressionTranslateContext &ctx, ExprGenericFunctionPrototype *expression)
{
	Print(ctx, "/* Definition of generic function prototype '%.*s' */", FMT_ISTR(expression->function->name->name));

	if(!expression->contextVariables.head)
	{
		Print(ctx, "0");
		return;
	}

	Print(ctx, "(");
	PrintLine(ctx);

	ctx.depth++;

	for(ExprBase *curr = expression->contextVariables.head; curr; curr = curr->next)
	{
		PrintIndent(ctx);

		Translate(ctx, curr);

		if(curr->next)
			Print(ctx, ", ");

		PrintLine(ctx);
	}

	ctx.depth--;

	PrintIndent(ctx);
	Print(ctx, ")");
}